

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O3

void __thiscall vigra::BmpDecoderImpl::read_colormap(BmpDecoderImpl *this)

{
  void *pvVar1;
  uint uVar2;
  undefined1 uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  bVar4 = (byte)(this->info_header).bit_count;
  void_vector_base::reserve(&(this->map).super_void_vector_base,(ulong)(uint)(3 << (bVar4 & 0x1f)));
  (this->map).super_void_vector_base.m_size = (this->map).super_void_vector_base.m_capacity;
  this->grayscale = true;
  uVar7 = 0;
  uVar6 = 1;
  do {
    uVar3 = std::istream::get();
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + (ulong)(uVar7 + 2)) = uVar3;
    uVar3 = std::istream::get();
    uVar5 = (ulong)(uVar7 + 1);
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + uVar5) = uVar3;
    uVar3 = std::istream::get();
    *(undefined1 *)((long)(this->map).super_void_vector_base.m_data + (ulong)uVar7) = uVar3;
    std::istream::get();
    if (this->grayscale == true) {
      pvVar1 = (this->map).super_void_vector_base.m_data;
      bVar8 = *(char *)((long)pvVar1 + (ulong)uVar7) == *(char *)((long)pvVar1 + uVar5);
      this->grayscale = bVar8;
      if (!bVar8) goto LAB_00124cda;
      bVar8 = *(char *)((long)pvVar1 + uVar5) == *(char *)((long)pvVar1 + (ulong)(uVar7 + 2));
    }
    else {
LAB_00124cda:
      bVar8 = false;
    }
    this->grayscale = bVar8;
    uVar7 = uVar7 + 3;
    uVar2 = uVar6 >> (bVar4 & 0x1f);
    uVar6 = uVar6 + 1;
    if (uVar2 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void BmpDecoderImpl::read_colormap ()
{
    const unsigned int num_colors = 1 << info_header.bit_count;
    map.resize( 3 * num_colors );
    grayscale = true;
    for ( unsigned int i = 0; i < num_colors; ++i ) {
        map[ 3 * i + 2 ] = stream.get();
        map[ 3 * i + 1 ] = stream.get();
        map[ 3 * i     ] = stream.get();
        stream.get(); // skip unused byte
        grayscale = grayscale && ( map[ 3 * i ] == map[ 3 * i + 1 ] );
        grayscale = grayscale && ( map[ 3 * i + 1 ] == map[ 3 * i + 2 ] );
    }
}